

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

int Ptex::v2_4::PtexUtils::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  void *pvVar2;
  uint in_ECX;
  void *in_RDX;
  char *dptr;
  uint uVar3;
  int in_R8D;
  uint in_R9D;
  long lVar4;
  
  uVar3 = (uint)src;
  uVar1 = uVar3 ^ in_R9D;
  if (in_ECX == in_R9D && uVar1 == 0) {
    pvVar2 = memcpy(in_RDX,dst,(long)(int)(uVar3 * in_R8D));
    return (int)pvVar2;
  }
  if (in_R8D * uVar3 != 0) {
    lVar4 = 0;
    do {
      pvVar2 = memcpy(in_RDX,dst + lVar4,(long)(int)in_R9D);
      uVar1 = (uint)pvVar2;
      in_RDX = (void *)((long)in_RDX + (long)(int)in_ECX);
      lVar4 = lVar4 + (int)uVar3;
    } while ((int)(in_R8D * uVar3) != lVar4);
  }
  return uVar1;
}

Assistant:

void copy(const void* src, int sstride, void* dst, int dstride,
          int vres, int rowlen)
{
    // regular non-tiled case
    if (sstride == rowlen && dstride == rowlen) {
        // packed case - copy in single block
        memcpy(dst, src, vres*rowlen);
    } else {
        // copy a row at a time
        const char* sptr = (const char*) src;
        char* dptr = (char*) dst;
        for (const char* end = sptr + vres*sstride; sptr != end;) {
            memcpy(dptr, sptr, rowlen);
            dptr += dstride;
            sptr += sstride;
        }
    }
}